

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAlias.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Identity::EntityAlias::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EntityAlias *this,Parameters *parameters)

{
  Client *client;
  Path local_58;
  Url local_38;
  
  client = *(Client **)this;
  local_58.value_._M_dataplus._M_p = (pointer)&local_58.value_.field_2;
  local_58.value_.field_2._M_allocated_capacity = 0;
  local_58.value_.field_2._8_8_ = 0;
  local_58.value_._M_string_length = 0;
  getUrl(&local_38,this,&local_58);
  HttpConsumer::post(__return_storage_ptr__,client,&local_38,parameters);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Identity::EntityAlias::create(const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{}), parameters);
}